

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::CompareSerializedScalars(uint8_t *a,uint8_t *b,FieldDef *key)

{
  char *pcVar1;
  double local_120;
  double local_118;
  float local_110;
  float local_10c;
  ulong local_108;
  unsigned_long local_100;
  long local_f8;
  long local_f0;
  uint local_e4;
  uint local_e0;
  int local_dc;
  uint32_t local_d8;
  unsigned_short local_d2;
  unsigned_short local_d0;
  unsigned_short local_ce;
  unsigned_short local_cc;
  byte local_ca;
  byte local_c9;
  char local_c8;
  char local_c7;
  byte local_c6;
  byte local_c5;
  byte local_c4;
  uchar local_c3;
  byte local_c2;
  uchar local_c1;
  double bv_12;
  double av_12;
  double def_12;
  float local_98;
  float bv_11;
  float av_11;
  float def_11;
  unsigned_long bv_10;
  unsigned_long av_10;
  uint64_t def_10;
  long bv_9;
  long av_9;
  int64_t def_9;
  uint local_58;
  uint bv_8;
  uint av_8;
  uint32_t def_8;
  int bv_7;
  int av_7;
  int32_t def_7;
  unsigned_short bv_6;
  unsigned_short av_6;
  uint16_t def_6;
  short bv_5;
  short av_5;
  int16_t def_5;
  byte local_30;
  uchar bv_4;
  uchar av_4;
  uint8_t def_4;
  char bv_3;
  char av_3;
  int8_t def_3;
  uchar bv_2;
  uchar av_2;
  uint8_t def_2;
  uchar bv_1;
  uchar av_1;
  uint8_t def_1;
  uchar bv;
  uchar av;
  uint8_t def;
  FieldDef *key_local;
  uint8_t *b_local;
  uint8_t *a_local;
  
  _av_2 = key;
  key_local = (FieldDef *)b;
  b_local = a;
  switch((key->value).type.base_type) {
  case BASE_TYPE_NONE:
    bv_2 = '\0';
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_char>(pcVar1,&bv_2);
    }
    if (b_local == (uint8_t *)0x0) {
      local_c1 = bv_2;
    }
    else {
      local_c1 = ReadScalar<unsigned_char>(b_local);
    }
    def_3 = local_c1;
    if (key_local == (FieldDef *)0x0) {
      local_c2 = bv_2;
    }
    else {
      local_c2 = ReadScalar<unsigned_char>(key_local);
    }
    a_local._7_1_ = (byte)def_3 < local_c2;
    break;
  case BASE_TYPE_UTYPE:
    bv_3 = '\0';
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_char>(pcVar1,(uchar *)&bv_3);
    }
    if (b_local == (uint8_t *)0x0) {
      local_c3 = bv_3;
    }
    else {
      local_c3 = ReadScalar<unsigned_char>(b_local);
    }
    def_4 = local_c3;
    if (key_local == (FieldDef *)0x0) {
      local_c4 = bv_3;
    }
    else {
      local_c4 = ReadScalar<unsigned_char>(key_local);
    }
    a_local._7_1_ = def_4 < local_c4;
    break;
  case BASE_TYPE_BOOL:
    bv_4 = '\0';
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_char>(pcVar1,&bv_4);
    }
    if (b_local == (uint8_t *)0x0) {
      local_c5 = bv_4;
    }
    else {
      local_c5 = ReadScalar<unsigned_char>(b_local);
    }
    local_30 = local_c5;
    if (key_local == (FieldDef *)0x0) {
      local_c6 = bv_4;
    }
    else {
      local_c6 = ReadScalar<unsigned_char>(key_local);
    }
    a_local._7_1_ = local_30 < local_c6;
    break;
  case BASE_TYPE_CHAR:
    def_5._0_1_ = '\0';
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<signed_char>(pcVar1,(char *)&def_5);
    }
    if (b_local == (uint8_t *)0x0) {
      local_c7 = (char)def_5;
    }
    else {
      local_c7 = ReadScalar<signed_char>(b_local);
    }
    av_5._1_1_ = local_c7;
    if (key_local == (FieldDef *)0x0) {
      local_c8 = (char)def_5;
    }
    else {
      local_c8 = ReadScalar<signed_char>(key_local);
    }
    a_local._7_1_ = av_5._1_1_ < local_c8;
    break;
  case BASE_TYPE_UCHAR:
    bv_5._1_1_ = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_char>(pcVar1,(uchar *)((long)&bv_5 + 1));
    }
    if (b_local == (uint8_t *)0x0) {
      local_c9 = bv_5._1_1_;
    }
    else {
      local_c9 = ReadScalar<unsigned_char>(b_local);
    }
    bv_5._0_1_ = local_c9;
    if (key_local == (FieldDef *)0x0) {
      local_ca = bv_5._1_1_;
    }
    else {
      local_ca = ReadScalar<unsigned_char>(key_local);
    }
    a_local._7_1_ = (byte)bv_5 < local_ca;
    break;
  case BASE_TYPE_SHORT:
    av_6 = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<short>(pcVar1,(short *)&av_6);
    }
    if (b_local == (uint8_t *)0x0) {
      local_cc = av_6;
    }
    else {
      local_cc = ReadScalar<short>(b_local);
    }
    bv_6 = local_cc;
    if (key_local == (FieldDef *)0x0) {
      local_ce = av_6;
    }
    else {
      local_ce = ReadScalar<short>(key_local);
    }
    a_local._7_1_ = (short)bv_6 < (short)local_ce;
    break;
  case BASE_TYPE_USHORT:
    def_7._0_2_ = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_short>(pcVar1,(unsigned_short *)&def_7);
    }
    if (b_local == (uint8_t *)0x0) {
      local_d0 = (unsigned_short)def_7;
    }
    else {
      local_d0 = ReadScalar<unsigned_short>(b_local);
    }
    av_7._2_2_ = local_d0;
    if (key_local == (FieldDef *)0x0) {
      local_d2 = (unsigned_short)def_7;
    }
    else {
      local_d2 = ReadScalar<unsigned_short>(key_local);
    }
    a_local._7_1_ = av_7._2_2_ < local_d2;
    break;
  case BASE_TYPE_INT:
    bv_7 = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<int>(pcVar1,&bv_7);
    }
    if (b_local == (uint8_t *)0x0) {
      local_d8 = bv_7;
    }
    else {
      local_d8 = ReadScalar<int>(b_local);
    }
    def_8 = local_d8;
    if (key_local == (FieldDef *)0x0) {
      local_dc = bv_7;
    }
    else {
      local_dc = ReadScalar<int>(key_local);
    }
    a_local._7_1_ = (int)def_8 < local_dc;
    break;
  case BASE_TYPE_UINT:
    bv_8 = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_int>(pcVar1,&bv_8);
    }
    if (b_local == (uint8_t *)0x0) {
      local_e0 = bv_8;
    }
    else {
      local_e0 = ReadScalar<unsigned_int>(b_local);
    }
    local_58 = local_e0;
    if (key_local == (FieldDef *)0x0) {
      local_e4 = bv_8;
    }
    else {
      local_e4 = ReadScalar<unsigned_int>(key_local);
    }
    a_local._7_1_ = local_58 < local_e4;
    break;
  case BASE_TYPE_LONG:
    av_9 = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<long>(pcVar1,&av_9);
    }
    if (b_local == (uint8_t *)0x0) {
      local_f0 = av_9;
    }
    else {
      local_f0 = ReadScalar<long>(b_local);
    }
    bv_9 = local_f0;
    if (key_local == (FieldDef *)0x0) {
      local_f8 = av_9;
    }
    else {
      local_f8 = ReadScalar<long>(key_local);
    }
    a_local._7_1_ = bv_9 < local_f8;
    break;
  case BASE_TYPE_ULONG:
    av_10 = 0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<unsigned_long>(pcVar1,&av_10);
    }
    if (b_local == (uint8_t *)0x0) {
      local_100 = av_10;
    }
    else {
      local_100 = ReadScalar<unsigned_long>(b_local);
    }
    bv_10 = local_100;
    if (key_local == (FieldDef *)0x0) {
      local_108 = av_10;
    }
    else {
      local_108 = ReadScalar<unsigned_long>(key_local);
    }
    a_local._7_1_ = bv_10 < local_108;
    break;
  case BASE_TYPE_FLOAT:
    bv_11 = 0.0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<float>(pcVar1,&bv_11);
    }
    if (b_local == (uint8_t *)0x0) {
      local_10c = bv_11;
    }
    else {
      local_10c = ReadScalar<float>(b_local);
    }
    local_98 = local_10c;
    if (key_local == (FieldDef *)0x0) {
      local_110 = bv_11;
    }
    else {
      local_110 = ReadScalar<float>(key_local);
    }
    a_local._7_1_ = local_98 < local_110;
    break;
  case BASE_TYPE_DOUBLE:
    av_12 = 0.0;
    if ((a == (uint8_t *)0x0) || (b == (uint8_t *)0x0)) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      StringToNumber<double>(pcVar1,&av_12);
    }
    if (b_local == (uint8_t *)0x0) {
      local_118 = av_12;
    }
    else {
      local_118 = ReadScalar<double>(b_local);
    }
    if (key_local == (FieldDef *)0x0) {
      local_120 = av_12;
    }
    else {
      local_120 = ReadScalar<double>(key_local);
    }
    a_local._7_1_ = local_118 < local_120;
    break;
  default:
    __assert_fail("false && \"scalar type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0xda,
                  "bool flatbuffers::(anonymous namespace)::CompareSerializedScalars(const uint8_t *, const uint8_t *, const FieldDef &)"
                 );
  }
  return a_local._7_1_;
}

Assistant:

static bool CompareSerializedScalars(const uint8_t *a, const uint8_t *b,
                                     const FieldDef &key) {
  switch (key.value.type.base_type) {
#define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...)                       \
  case BASE_TYPE_##ENUM: {                                              \
    CTYPE def = static_cast<CTYPE>(0);                                  \
    if (!a || !b) { StringToNumber(key.value.constant.c_str(), &def); } \
    const auto av = a ? ReadScalar<CTYPE>(a) : def;                     \
    const auto bv = b ? ReadScalar<CTYPE>(b) : def;                     \
    return av < bv;                                                     \
  }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
#undef FLATBUFFERS_TD
    default: {
      FLATBUFFERS_ASSERT(false && "scalar type expected");
      return false;
    }
  }
}